

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPServer.cpp
# Opt level: O0

void __thiscall SocketPP::TCPServer::~TCPServer(TCPServer *this)

{
  thread *this_00;
  TCPServer *this_local;
  
  (this->super_SocketServer).super_Socket._vptr_Socket = (_func_int **)&PTR_onConnected_00120cc8;
  (this->super_SocketServer).super_Socket.field_0xd = 1;
  std::condition_variable::notify_one();
  std::thread::join();
  this_00 = this->sendThread_;
  if (this_00 != (thread *)0x0) {
    std::thread::~thread(this_00);
    operator_delete(this_00);
  }
  std::function<void_(const_SocketPP::TCPStream_&)>::~function(&this->discHandle_);
  std::function<void_(const_SocketPP::TCPStream_&)>::~function(&this->connHandle_);
  std::function<void_(const_SocketPP::Message_&)>::~function(&this->recvHandle_);
  std::function<void_(const_SocketPP::Message_&)>::~function(&this->sendHandle_);
  std::function<bool_(const_SocketPP::Message_&)>::~function(&this->sendInterceptor_);
  std::condition_variable::~condition_variable(&this->msgQueueCondition_);
  std::queue<SocketPP::Message,_std::deque<SocketPP::Message,_std::allocator<SocketPP::Message>_>_>
  ::~queue(&this->msgQueue_);
  std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>::~vector
            (&this->connectedStreams_);
  SocketServer::~SocketServer(&this->super_SocketServer);
  return;
}

Assistant:

TCPServer::~TCPServer() {
    stopped_ = true;
    msgQueueCondition_.notify_one();
    sendThread_->join();
    delete sendThread_;
}